

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

variables_map * parseArguments(int argc,char **argv)

{
  __type _Var1;
  char *pcVar2;
  typed_value<unsigned_long,_char> *ptVar3;
  size_type sVar4;
  ostream *poVar5;
  char **in_RDX;
  undefined4 in_register_0000003c;
  variables_map *this;
  allocator local_179;
  string local_178 [32];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_158;
  basic_parsed_options<char> local_130;
  undefined1 local_101;
  unsigned_long local_100 [2];
  ulong local_f0;
  unsigned_long local_e8;
  undefined8 local_e0 [3];
  allocator local_c1;
  string local_c0 [32];
  options_description local_a0 [8];
  options_description options;
  char **argv_local;
  int argc_local;
  variables_map *vm;
  
  this = (variables_map *)CONCAT44(in_register_0000003c,argc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"Usage",&local_c1);
  boost::program_options::options_description::options_description
            (local_a0,local_c0,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  local_e0[0] = boost::program_options::options_description::add_options();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_e0,"test");
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"benchmark");
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()(pcVar2,"path");
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()(pcVar2,"tree");
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"random");
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"path-complete");
  ptVar3 = boost::program_options::value<unsigned_long>(&vertices);
  local_e8 = 100;
  ptVar3 = boost::program_options::typed_value<unsigned_long,_char>::default_value(ptVar3,&local_e8)
  ;
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"vertices,v",(char *)ptVar3);
  ptVar3 = boost::program_options::value<unsigned_long>(&edges);
  _Var1 = std::log<int>(100);
  local_f0 = (ulong)(_Var1 * 100.0);
  local_f0 = local_f0 | (long)(_Var1 * 100.0 - 9.223372036854776e+18) & (long)local_f0 >> 0x3f;
  ptVar3 = boost::program_options::typed_value<unsigned_long,_char>::default_value(ptVar3,&local_f0)
  ;
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"edges,e",(char *)ptVar3);
  ptVar3 = boost::program_options::value<unsigned_long>(&deletions);
  local_100[1] = 0x32;
  ptVar3 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     (ptVar3,local_100 + 1);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"deletions,d",(char *)ptVar3);
  ptVar3 = boost::program_options::value<unsigned_long>(&queries);
  local_100[0] = 0x32;
  ptVar3 = boost::program_options::typed_value<unsigned_long,_char>::default_value(ptVar3,local_100)
  ;
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"queries,q",(char *)ptVar3);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"example");
  boost::program_options::options_description_easy_init::operator()(pcVar2,"help");
  local_101 = 0;
  boost::program_options::variables_map::variables_map(this);
  local_158.super_function_base.functor._8_8_ = 0;
  local_158.super_function_base.functor._16_8_ = 0;
  local_158.super_function_base.vtable = (vtable_base *)0x0;
  local_158.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function1(&local_158);
  boost::program_options::parse_command_line<char>
            (&local_130,(int)argv,in_RDX,local_a0,0,&local_158);
  boost::program_options::store((basic_parsed_options *)&local_130,this,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_130);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_158);
  boost::program_options::notify(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"help",&local_179);
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)(this + 0x10),(key_type *)local_178);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  if (sVar4 != 0 || (int)argv < 2) {
    poVar5 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,local_a0);
    std::operator<<(poVar5,"\n");
    exit(1);
  }
  local_101 = 1;
  boost::program_options::options_description::~options_description(local_a0);
  return this;
}

Assistant:

boost::program_options::variables_map parseArguments(int argc, char *const *argv)
{
    boost::program_options::options_description options("Usage");
    options.add_options()
            ("test", "run all tests")
            ("benchmark", "run benchmark specified benchmarks")
            ("path", "run benchmark with path graph")
            ("tree", "run benchmark with tree graph")
            ("random", "run benchmark with random graph")
            ("path-complete", "run benchmark with path of complete subgraphs")
            ("vertices,v", boost::program_options::value<unsigned long>(&vertices)
                    ->default_value(100), "specify number of vertices")
            ("edges,e", boost::program_options::value<unsigned long>(&edges)
                     ->default_value(static_cast<const unsigned long &>(100*log(100))),
             "specify number of edges (only for random graphs)")
            ("deletions,d", boost::program_options::value<unsigned long>(&deletions)
                    ->default_value(50), "specify number of deletions")
            ("queries,q", boost::program_options::value<unsigned long>(&queries)
                    ->default_value(50), "specify number of queries (default 50)")
            ("example", "run an example")
            ("help", "produce help message")
            ;

    boost::program_options::variables_map vm;
    store(parse_command_line(argc, argv, options), vm);
    notify(vm);

    if (vm.count("help") || argc < 2) {
        std::cout << options << "\n";
        exit(1);
    }

    return vm;
}